

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::increase_elimination_bound(Internal *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 in_R9;
  int idx;
  uint lit;
  
  lVar2 = (this->lim).elimbound;
  lVar6 = (long)(this->opts).elimboundmax;
  if (lVar2 < lVar6) {
    lVar5 = 1;
    if (lVar2 != 0) {
      lVar5 = lVar2 * 2;
    }
    lVar4 = 0;
    if (-1 < lVar2) {
      lVar4 = lVar5;
    }
    lVar5 = lVar6;
    if (lVar4 < lVar6) {
      lVar5 = lVar4;
    }
    (this->lim).elimbound = lVar5;
    if (this->internal != (Internal *)0x0) {
      if (lVar4 < lVar6) {
        lVar6 = lVar4;
      }
      phase(this->internal,"elim-phase",(this->stats).elimphases,"new elimination bound %ld",lVar6,
            in_R9,lVar2);
    }
    iVar1 = *(this->vars).n;
    for (lit = 1; lit - iVar1 != 1; lit = lit + 1) {
      uVar3 = -lit;
      if (0 < (int)lit) {
        uVar3 = lit;
      }
      if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar3] & 0x7000100) == 0x1000000) {
        mark_elim(this,lit);
      }
    }
    report(this,'^',0);
    return;
  }
  return;
}

Assistant:

void Internal::increase_elimination_bound () {

  if (lim.elimbound >= opts.elimboundmax)
    return;

  if (lim.elimbound < 0)
    lim.elimbound = 0;
  else if (!lim.elimbound)
    lim.elimbound = 1;
  else
    lim.elimbound *= 2;

  if (lim.elimbound > opts.elimboundmax)
    lim.elimbound = opts.elimboundmax;

  PHASE ("elim-phase", stats.elimphases,
         "new elimination bound %" PRId64 "", lim.elimbound);

  // Now reschedule all active variables for elimination again.
  //
#ifdef LOGGING
  int count = 0;
#endif
  for (auto idx : vars) {
    if (!active (idx))
      continue;
    if (flags (idx).elim)
      continue;
    mark_elim (idx);
#ifdef LOGGING
    count++;
#endif
  }
  LOG ("marked %d variables as elimination candidates", count);

  report ('^');
}